

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

data<Imath_3_2::half> * __thiscall
anon_unknown.dwarf_868a0::data<Imath_3_2::half>::operator<<(data<Imath_3_2::half> *this,float value)

{
  char cVar1;
  ushort uVar2;
  float fVar3;
  uint uVar4;
  half *__args;
  iterator __position;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *this_00;
  half local_c;
  half local_a;
  
  fVar3 = ABS(value);
  uVar2 = (ushort)((uint)value >> 0x10) & 0x8000;
  if (this->_inserting_result == true) {
    if ((uint)fVar3 < 0x38800000) {
      if ((0x33000000 < (uint)fVar3) &&
         (uVar4 = (uint)value & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar3 >> 0x17),
         uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
         0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
        uVar2 = uVar2 + 1;
      }
    }
    else if ((uint)fVar3 < 0x7f800000) {
      if ((uint)fVar3 < 0x477ff000) {
        uVar2 = (ushort)((int)fVar3 + 0x8000fffU + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd) |
                uVar2;
      }
      else {
        uVar2 = uVar2 | 0x7c00;
      }
    }
    else {
      uVar2 = uVar2 | 0x7c00;
      if (fVar3 != INFINITY) {
        uVar4 = (uint)fVar3 >> 0xd & 0x3ff;
        uVar2 = uVar2 | (ushort)uVar4 | (ushort)(uVar4 == 0);
      }
    }
    __position._M_current =
         (this->_current_result).
         super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->_current_result).
        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      (__position._M_current)->_h = uVar2;
      (this->_current_result).super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      goto LAB_0013a232;
    }
    this_00 = &this->_current_result;
    __args = &local_a;
    local_a._h = uVar2;
  }
  else {
    if ((uint)fVar3 < 0x38800000) {
      if ((0x33000000 < (uint)fVar3) &&
         (uVar4 = (uint)value & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar3 >> 0x17),
         uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
         0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
        uVar2 = uVar2 + 1;
      }
    }
    else if ((uint)fVar3 < 0x7f800000) {
      if ((uint)fVar3 < 0x477ff000) {
        uVar2 = (ushort)((int)fVar3 + 0x8000fffU + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd) |
                uVar2;
      }
      else {
        uVar2 = uVar2 | 0x7c00;
      }
    }
    else {
      uVar2 = uVar2 | 0x7c00;
      if (fVar3 != INFINITY) {
        uVar4 = (uint)fVar3 >> 0xd & 0x3ff;
        uVar2 = uVar2 | (ushort)uVar4 | (ushort)(uVar4 == 0);
      }
    }
    __position._M_current =
         (this->_current_sample).
         super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->_current_sample).
        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      (__position._M_current)->_h = uVar2;
      (this->_current_sample).super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      goto LAB_0013a232;
    }
    this_00 = &this->_current_sample;
    __args = &local_c;
    local_c._h = uVar2;
  }
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::_M_realloc_insert<Imath_3_2::half>
            (this_00,__position,__args);
LAB_0013a232:
  this->_started = true;
  return this;
}

Assistant:

data& operator<< (float value)
    {
        if (_inserting_result) { _current_result.push_back (value); }
        else { _current_sample.push_back (T (value)); }
        _started = true;
        return *this;
    }